

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O2

void toggle_object_in_list(Am_Object *widget,Am_Object *new_object,Am_Value_List *list)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Value *in_value;
  Am_Object AStack_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object item;
  
  Am_Value_List::Start(list);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(new_object);
  bVar1 = Am_Value_List::Member(list,pAVar2);
  if (bVar1) {
    Am_Value_List::Delete(list,true);
    return;
  }
  Am_Value_List::Start(list);
  do {
    bVar1 = Am_Value_List::Last(list);
    if (bVar1) {
      pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(new_object);
      Am_Value_List::Add(list,pAVar2,Am_TAIL,true);
      return;
    }
    in_value = Am_Value_List::Get(list);
    Am_Object::Am_Object(&item,in_value);
    Am_Object::Am_Object(&local_50,new_object);
    bVar1 = Am_Object::Is_Part_Of(&item,&local_50);
    if (bVar1) {
LAB_00250f7e:
      Am_Object::~Am_Object(&local_50);
LAB_00250f88:
      Am_Value_List::Delete(list,true);
    }
    else {
      Am_Object::Am_Object(&AStack_58,&item);
      bVar1 = Am_Object::Is_Part_Of(new_object,&AStack_58);
      if (bVar1) {
        Am_Object::~Am_Object(&AStack_58);
        goto LAB_00250f7e;
      }
      Am_Object::Get_Owner(&local_40,(Am_Slot_Flags)&item);
      Am_Object::Get_Owner(&local_48,(Am_Slot_Flags)new_object);
      bVar1 = Am_Object::operator!=(&local_40,&local_48);
      Am_Object::~Am_Object(&local_48);
      Am_Object::~Am_Object(&local_40);
      Am_Object::~Am_Object(&AStack_58);
      Am_Object::~Am_Object(&local_50);
      if (bVar1) goto LAB_00250f88;
    }
    Am_Object::~Am_Object(&item);
    Am_Value_List::Next(list);
  } while( true );
}

Assistant:

void
toggle_object_in_list(const Am_Object &widget, Am_Object new_object,
                      Am_Value_List &list)
{
  list.Start();
  if (list.Member(new_object)) {
    Am_INTER_TRACE_PRINT(widget, "Selection handle removing "
                                     << new_object << " from " << widget);
    list.Delete();
  } else { // not a member, add it
    Am_INTER_TRACE_PRINT(widget, "Selection handle adding "
                                     << new_object << " to " << widget);
    // Not allowed to have objects selected that are parts of
    // new_object, owners of new_object, or have owners different from
    // new_object.  This can happen when you have select into groups.
    for (list.Start(); !list.Last(); list.Next()) {
      Am_Object item = list.Get();
      if (item.Is_Part_Of(new_object) || new_object.Is_Part_Of(item) ||
          item.Get_Owner() != new_object.Get_Owner())
        list.Delete();
    }
    list.Add(new_object);
  }
}